

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.c
# Opt level: O3

void free_array2(void **p,int height)

{
  ulong uVar1;
  
  if (p != (void **)0x0) {
    if (0 < height) {
      uVar1 = 0;
      do {
        free(p[uVar1]);
        p[uVar1] = (void *)0x0;
        uVar1 = uVar1 + 1;
      } while ((uint)height != uVar1);
    }
    free(p);
    return;
  }
  return;
}

Assistant:

void free_array2(void** p, int height)	
{
	int i = 0;

	if (p == NULL)	
	{
		return;
	}

	for (i = 0; i < height; i++)	
	{
		free(p[i]); p[i] = NULL;
	}
	free(p); p = NULL;
}